

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

int32 Js::JavascriptOperators::OP_GetNativeIntElementI_UInt32
                (Var instance,uint32 index,ScriptContext *scriptContext)

{
  int32 iVar1;
  Var index_00;
  ScriptContext *scriptContext_local;
  uint32 index_local;
  Var instance_local;
  
  index_00 = JavascriptNumber::ToVar(index,scriptContext);
  iVar1 = OP_GetNativeIntElementI(instance,index_00);
  return iVar1;
}

Assistant:

int32 JavascriptOperators::OP_GetNativeIntElementI_UInt32(Var instance, uint32 index, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(Op_GetNativeIntElementI_UInt32);
        JIT_HELPER_SAME_ATTRIBUTES(Op_GetNativeIntElementI_UInt32, Op_GetNativeIntElementI);
#if FLOATVAR
        return OP_GetNativeIntElementI(instance, Js::JavascriptNumber::ToVar(index, scriptContext));
#else
        char buffer[sizeof(Js::JavascriptNumber)];
        return OP_GetNativeIntElementI(instance, Js::JavascriptNumber::ToVarInPlace(index, scriptContext,
            (Js::JavascriptNumber *)buffer));
#endif
        JIT_HELPER_END(Op_GetNativeIntElementI_UInt32);
    }